

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O2

char * cards_print(Card **cards,uchar cardsCount,_Bool showDownCards)

{
  char (*pacVar1) [255];
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (cardsPrintBufIndex == 0xff) {
    cardsPrintBufIndex = '\0';
  }
  uVar4 = (ulong)cardsPrintBufIndex;
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xbf) = '\0';
  *(char *)((long)pacVar1 + 0xc0) = '\0';
  *(char *)((long)pacVar1 + 0xc1) = '\0';
  *(char *)((long)pacVar1 + 0xc2) = '\0';
  *(char *)((long)pacVar1 + 0xc3) = '\0';
  *(char *)((long)pacVar1 + 0xc4) = '\0';
  *(char *)((long)pacVar1 + 0xc5) = '\0';
  *(char *)((long)pacVar1 + 0xc6) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 199) = '\0';
  *(char *)((long)pacVar1 + 200) = '\0';
  *(char *)((long)pacVar1 + 0xc9) = '\0';
  *(char *)((long)pacVar1 + 0xca) = '\0';
  *(char *)((long)pacVar1 + 0xcb) = '\0';
  *(char *)((long)pacVar1 + 0xcc) = '\0';
  *(char *)((long)pacVar1 + 0xcd) = '\0';
  *(char *)((long)pacVar1 + 0xce) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xcf) = '\0';
  *(char *)((long)pacVar1 + 0xd0) = '\0';
  *(char *)((long)pacVar1 + 0xd1) = '\0';
  *(char *)((long)pacVar1 + 0xd2) = '\0';
  *(char *)((long)pacVar1 + 0xd3) = '\0';
  *(char *)((long)pacVar1 + 0xd4) = '\0';
  *(char *)((long)pacVar1 + 0xd5) = '\0';
  *(char *)((long)pacVar1 + 0xd6) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xd7) = '\0';
  *(char *)((long)pacVar1 + 0xd8) = '\0';
  *(char *)((long)pacVar1 + 0xd9) = '\0';
  *(char *)((long)pacVar1 + 0xda) = '\0';
  *(char *)((long)pacVar1 + 0xdb) = '\0';
  *(char *)((long)pacVar1 + 0xdc) = '\0';
  *(char *)((long)pacVar1 + 0xdd) = '\0';
  *(char *)((long)pacVar1 + 0xde) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xdf) = '\0';
  *(char *)((long)pacVar1 + 0xe0) = '\0';
  *(char *)((long)pacVar1 + 0xe1) = '\0';
  *(char *)((long)pacVar1 + 0xe2) = '\0';
  *(char *)((long)pacVar1 + 0xe3) = '\0';
  *(char *)((long)pacVar1 + 0xe4) = '\0';
  *(char *)((long)pacVar1 + 0xe5) = '\0';
  *(char *)((long)pacVar1 + 0xe6) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xe7) = '\0';
  *(char *)((long)pacVar1 + 0xe8) = '\0';
  *(char *)((long)pacVar1 + 0xe9) = '\0';
  *(char *)((long)pacVar1 + 0xea) = '\0';
  *(char *)((long)pacVar1 + 0xeb) = '\0';
  *(char *)((long)pacVar1 + 0xec) = '\0';
  *(char *)((long)pacVar1 + 0xed) = '\0';
  *(char *)((long)pacVar1 + 0xee) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xef) = '\0';
  *(char *)((long)pacVar1 + 0xf0) = '\0';
  *(char *)((long)pacVar1 + 0xf1) = '\0';
  *(char *)((long)pacVar1 + 0xf2) = '\0';
  *(char *)((long)pacVar1 + 0xf3) = '\0';
  *(char *)((long)pacVar1 + 0xf4) = '\0';
  *(char *)((long)pacVar1 + 0xf5) = '\0';
  *(char *)((long)pacVar1 + 0xf6) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xf7) = '\0';
  *(char *)((long)pacVar1 + 0xf8) = '\0';
  *(char *)((long)pacVar1 + 0xf9) = '\0';
  *(char *)((long)pacVar1 + 0xfa) = '\0';
  *(char *)((long)pacVar1 + 0xfb) = '\0';
  *(char *)((long)pacVar1 + 0xfc) = '\0';
  *(char *)((long)pacVar1 + 0xfd) = '\0';
  *(char *)((long)pacVar1 + 0xfe) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x80) = '\0';
  *(char *)((long)pacVar1 + 0x81) = '\0';
  *(char *)((long)pacVar1 + 0x82) = '\0';
  *(char *)((long)pacVar1 + 0x83) = '\0';
  *(char *)((long)pacVar1 + 0x84) = '\0';
  *(char *)((long)pacVar1 + 0x85) = '\0';
  *(char *)((long)pacVar1 + 0x86) = '\0';
  *(char *)((long)pacVar1 + 0x87) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x88) = '\0';
  *(char *)((long)pacVar1 + 0x89) = '\0';
  *(char *)((long)pacVar1 + 0x8a) = '\0';
  *(char *)((long)pacVar1 + 0x8b) = '\0';
  *(char *)((long)pacVar1 + 0x8c) = '\0';
  *(char *)((long)pacVar1 + 0x8d) = '\0';
  *(char *)((long)pacVar1 + 0x8e) = '\0';
  *(char *)((long)pacVar1 + 0x8f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x90) = '\0';
  *(char *)((long)pacVar1 + 0x91) = '\0';
  *(char *)((long)pacVar1 + 0x92) = '\0';
  *(char *)((long)pacVar1 + 0x93) = '\0';
  *(char *)((long)pacVar1 + 0x94) = '\0';
  *(char *)((long)pacVar1 + 0x95) = '\0';
  *(char *)((long)pacVar1 + 0x96) = '\0';
  *(char *)((long)pacVar1 + 0x97) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x98) = '\0';
  *(char *)((long)pacVar1 + 0x99) = '\0';
  *(char *)((long)pacVar1 + 0x9a) = '\0';
  *(char *)((long)pacVar1 + 0x9b) = '\0';
  *(char *)((long)pacVar1 + 0x9c) = '\0';
  *(char *)((long)pacVar1 + 0x9d) = '\0';
  *(char *)((long)pacVar1 + 0x9e) = '\0';
  *(char *)((long)pacVar1 + 0x9f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xa0) = '\0';
  *(char *)((long)pacVar1 + 0xa1) = '\0';
  *(char *)((long)pacVar1 + 0xa2) = '\0';
  *(char *)((long)pacVar1 + 0xa3) = '\0';
  *(char *)((long)pacVar1 + 0xa4) = '\0';
  *(char *)((long)pacVar1 + 0xa5) = '\0';
  *(char *)((long)pacVar1 + 0xa6) = '\0';
  *(char *)((long)pacVar1 + 0xa7) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xa8) = '\0';
  *(char *)((long)pacVar1 + 0xa9) = '\0';
  *(char *)((long)pacVar1 + 0xaa) = '\0';
  *(char *)((long)pacVar1 + 0xab) = '\0';
  *(char *)((long)pacVar1 + 0xac) = '\0';
  *(char *)((long)pacVar1 + 0xad) = '\0';
  *(char *)((long)pacVar1 + 0xae) = '\0';
  *(char *)((long)pacVar1 + 0xaf) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xb0) = '\0';
  *(char *)((long)pacVar1 + 0xb1) = '\0';
  *(char *)((long)pacVar1 + 0xb2) = '\0';
  *(char *)((long)pacVar1 + 0xb3) = '\0';
  *(char *)((long)pacVar1 + 0xb4) = '\0';
  *(char *)((long)pacVar1 + 0xb5) = '\0';
  *(char *)((long)pacVar1 + 0xb6) = '\0';
  *(char *)((long)pacVar1 + 0xb7) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0xb8) = '\0';
  *(char *)((long)pacVar1 + 0xb9) = '\0';
  *(char *)((long)pacVar1 + 0xba) = '\0';
  *(char *)((long)pacVar1 + 0xbb) = '\0';
  *(char *)((long)pacVar1 + 0xbc) = '\0';
  *(char *)((long)pacVar1 + 0xbd) = '\0';
  *(char *)((long)pacVar1 + 0xbe) = '\0';
  *(char *)((long)pacVar1 + 0xbf) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x40) = '\0';
  *(char *)((long)pacVar1 + 0x41) = '\0';
  *(char *)((long)pacVar1 + 0x42) = '\0';
  *(char *)((long)pacVar1 + 0x43) = '\0';
  *(char *)((long)pacVar1 + 0x44) = '\0';
  *(char *)((long)pacVar1 + 0x45) = '\0';
  *(char *)((long)pacVar1 + 0x46) = '\0';
  *(char *)((long)pacVar1 + 0x47) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x48) = '\0';
  *(char *)((long)pacVar1 + 0x49) = '\0';
  *(char *)((long)pacVar1 + 0x4a) = '\0';
  *(char *)((long)pacVar1 + 0x4b) = '\0';
  *(char *)((long)pacVar1 + 0x4c) = '\0';
  *(char *)((long)pacVar1 + 0x4d) = '\0';
  *(char *)((long)pacVar1 + 0x4e) = '\0';
  *(char *)((long)pacVar1 + 0x4f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x50) = '\0';
  *(char *)((long)pacVar1 + 0x51) = '\0';
  *(char *)((long)pacVar1 + 0x52) = '\0';
  *(char *)((long)pacVar1 + 0x53) = '\0';
  *(char *)((long)pacVar1 + 0x54) = '\0';
  *(char *)((long)pacVar1 + 0x55) = '\0';
  *(char *)((long)pacVar1 + 0x56) = '\0';
  *(char *)((long)pacVar1 + 0x57) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x58) = '\0';
  *(char *)((long)pacVar1 + 0x59) = '\0';
  *(char *)((long)pacVar1 + 0x5a) = '\0';
  *(char *)((long)pacVar1 + 0x5b) = '\0';
  *(char *)((long)pacVar1 + 0x5c) = '\0';
  *(char *)((long)pacVar1 + 0x5d) = '\0';
  *(char *)((long)pacVar1 + 0x5e) = '\0';
  *(char *)((long)pacVar1 + 0x5f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x60) = '\0';
  *(char *)((long)pacVar1 + 0x61) = '\0';
  *(char *)((long)pacVar1 + 0x62) = '\0';
  *(char *)((long)pacVar1 + 99) = '\0';
  *(char *)((long)pacVar1 + 100) = '\0';
  *(char *)((long)pacVar1 + 0x65) = '\0';
  *(char *)((long)pacVar1 + 0x66) = '\0';
  *(char *)((long)pacVar1 + 0x67) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x68) = '\0';
  *(char *)((long)pacVar1 + 0x69) = '\0';
  *(char *)((long)pacVar1 + 0x6a) = '\0';
  *(char *)((long)pacVar1 + 0x6b) = '\0';
  *(char *)((long)pacVar1 + 0x6c) = '\0';
  *(char *)((long)pacVar1 + 0x6d) = '\0';
  *(char *)((long)pacVar1 + 0x6e) = '\0';
  *(char *)((long)pacVar1 + 0x6f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x70) = '\0';
  *(char *)((long)pacVar1 + 0x71) = '\0';
  *(char *)((long)pacVar1 + 0x72) = '\0';
  *(char *)((long)pacVar1 + 0x73) = '\0';
  *(char *)((long)pacVar1 + 0x74) = '\0';
  *(char *)((long)pacVar1 + 0x75) = '\0';
  *(char *)((long)pacVar1 + 0x76) = '\0';
  *(char *)((long)pacVar1 + 0x77) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x78) = '\0';
  *(char *)((long)pacVar1 + 0x79) = '\0';
  *(char *)((long)pacVar1 + 0x7a) = '\0';
  *(char *)((long)pacVar1 + 0x7b) = '\0';
  *(char *)((long)pacVar1 + 0x7c) = '\0';
  *(char *)((long)pacVar1 + 0x7d) = '\0';
  *(char *)((long)pacVar1 + 0x7e) = '\0';
  *(char *)((long)pacVar1 + 0x7f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0) = '\0';
  *(char *)((long)pacVar1 + 1) = '\0';
  *(char *)((long)pacVar1 + 2) = '\0';
  *(char *)((long)pacVar1 + 3) = '\0';
  *(char *)((long)pacVar1 + 4) = '\0';
  *(char *)((long)pacVar1 + 5) = '\0';
  *(char *)((long)pacVar1 + 6) = '\0';
  *(char *)((long)pacVar1 + 7) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 8) = '\0';
  *(char *)((long)pacVar1 + 9) = '\0';
  *(char *)((long)pacVar1 + 10) = '\0';
  *(char *)((long)pacVar1 + 0xb) = '\0';
  *(char *)((long)pacVar1 + 0xc) = '\0';
  *(char *)((long)pacVar1 + 0xd) = '\0';
  *(char *)((long)pacVar1 + 0xe) = '\0';
  *(char *)((long)pacVar1 + 0xf) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x10) = '\0';
  *(char *)((long)pacVar1 + 0x11) = '\0';
  *(char *)((long)pacVar1 + 0x12) = '\0';
  *(char *)((long)pacVar1 + 0x13) = '\0';
  *(char *)((long)pacVar1 + 0x14) = '\0';
  *(char *)((long)pacVar1 + 0x15) = '\0';
  *(char *)((long)pacVar1 + 0x16) = '\0';
  *(char *)((long)pacVar1 + 0x17) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x18) = '\0';
  *(char *)((long)pacVar1 + 0x19) = '\0';
  *(char *)((long)pacVar1 + 0x1a) = '\0';
  *(char *)((long)pacVar1 + 0x1b) = '\0';
  *(char *)((long)pacVar1 + 0x1c) = '\0';
  *(char *)((long)pacVar1 + 0x1d) = '\0';
  *(char *)((long)pacVar1 + 0x1e) = '\0';
  *(char *)((long)pacVar1 + 0x1f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x20) = '\0';
  *(char *)((long)pacVar1 + 0x21) = '\0';
  *(char *)((long)pacVar1 + 0x22) = '\0';
  *(char *)((long)pacVar1 + 0x23) = '\0';
  *(char *)((long)pacVar1 + 0x24) = '\0';
  *(char *)((long)pacVar1 + 0x25) = '\0';
  *(char *)((long)pacVar1 + 0x26) = '\0';
  *(char *)((long)pacVar1 + 0x27) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x28) = '\0';
  *(char *)((long)pacVar1 + 0x29) = '\0';
  *(char *)((long)pacVar1 + 0x2a) = '\0';
  *(char *)((long)pacVar1 + 0x2b) = '\0';
  *(char *)((long)pacVar1 + 0x2c) = '\0';
  *(char *)((long)pacVar1 + 0x2d) = '\0';
  *(char *)((long)pacVar1 + 0x2e) = '\0';
  *(char *)((long)pacVar1 + 0x2f) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x30) = '\0';
  *(char *)((long)pacVar1 + 0x31) = '\0';
  *(char *)((long)pacVar1 + 0x32) = '\0';
  *(char *)((long)pacVar1 + 0x33) = '\0';
  *(char *)((long)pacVar1 + 0x34) = '\0';
  *(char *)((long)pacVar1 + 0x35) = '\0';
  *(char *)((long)pacVar1 + 0x36) = '\0';
  *(char *)((long)pacVar1 + 0x37) = '\0';
  pacVar1 = cardsPrintBufs + uVar4;
  *(char *)((long)pacVar1 + 0x38) = '\0';
  *(char *)((long)pacVar1 + 0x39) = '\0';
  *(char *)((long)pacVar1 + 0x3a) = '\0';
  *(char *)((long)pacVar1 + 0x3b) = '\0';
  *(char *)((long)pacVar1 + 0x3c) = '\0';
  *(char *)((long)pacVar1 + 0x3d) = '\0';
  *(char *)((long)pacVar1 + 0x3e) = '\0';
  *(char *)((long)pacVar1 + 0x3f) = '\0';
  for (uVar4 = 0; cardsCount != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)cardsPrintBufIndex;
    if (uVar4 != 0) {
      sVar2 = strlen(cardsPrintBufs[uVar5]);
      pcVar3 = cardsPrintBufs[uVar5] + sVar2;
      pcVar3[0] = ' ';
      pcVar3[1] = '\0';
    }
    pcVar3 = card_print(cards[uVar4],showDownCards);
    strcat(cardsPrintBufs[uVar5],pcVar3);
  }
  cardsPrintBufIndex = cardsPrintBufIndex + 1;
  return cardPrintBufs[(ulong)cardsPrintBufIndex * 0x33 + 0xcd];
}

Assistant:

char * cards_print(Card ** cards, unsigned char cardsCount, bool showDownCards)
{
	unsigned char i;
	if(cardsPrintBufIndex>=255)
		cardsPrintBufIndex = 0;

	memset(cardsPrintBufs[cardsPrintBufIndex], 0, 255);

	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			strcat(cardsPrintBufs[cardsPrintBufIndex], " ");

		strcat(cardsPrintBufs[cardsPrintBufIndex], card_print(cards[i], showDownCards));
	}

	cardsPrintBufIndex++;
	return cardsPrintBufs[(cardsPrintBufIndex-1)];
}